

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O1

void __thiscall
QProcessEnvironmentPrivate::QProcessEnvironmentPrivate
          (QProcessEnvironmentPrivate *this,QProcessEnvironmentPrivate *other)

{
  NameHash *this_00;
  QMutex *this_01;
  __pointer_type copy;
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar1;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *pDVar2;
  bool bVar3;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  pQVar1 = (other->vars).d.d.ptr;
  (this->vars).d.d.ptr = pQVar1;
  if (pQVar1 != (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  this_00 = &this->nameMap;
  this_01 = &other->nameMapMutex;
  (this->nameMap).d = (Data *)0x0;
  (this->nameMapMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  if ((other->nameMapMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar3) goto LAB_0042dead;
  }
  QBasicMutex::lockInternal(&this_01->super_QBasicMutex);
LAB_0042dead:
  QHash<QString,_QByteArray>::operator=(this_00,&other->nameMap);
  pDVar2 = this_00->d;
  if ((pDVar2 == (Data<QHashPrivate::Node<QString,_QByteArray>_> *)0x0) ||
     (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QByteArray>_>::detached(pDVar2);
    this_00->d = pDVar2;
  }
  LOCK();
  copy = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_01->super_QBasicMutex,copy);
    return;
  }
  return;
}

Assistant:

QProcessEnvironmentPrivate(const QProcessEnvironmentPrivate &other) :
        QSharedData(), vars(other.vars)
    {
        // We don't need to lock our own mutex, as this object is new and
        // consequently not shared. For the same reason, non-const methods
        // do not need a lock, as they detach objects (however, we need to
        // ensure that they really detach before using prepareName()).
        NameMapMutexLocker locker(&other);
        nameMap = other.nameMap;
        // We need to detach our nameMap, so that our mutex can protect it.
        // As we are being detached, it likely would be detached a moment later anyway.
        nameMap.detach();
    }